

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelativeOffset.cpp
# Opt level: O0

ValueNumber __thiscall ValueRelativeOffset::BaseValueNumber(ValueRelativeOffset *this)

{
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  undefined4 *puVar4;
  ValueRelativeOffset *this_local;
  
  bVar2 = IsValid(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueRelativeOffset.cpp"
                       ,0x2c,"(IsValid())","IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  VVar3 = ::Value::GetValueNumber(this->baseValue);
  return VVar3;
}

Assistant:

ValueNumber ValueRelativeOffset::BaseValueNumber() const
{
    Assert(IsValid());
    return baseValue->GetValueNumber();
}